

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_NtkCreateNode(Acb_Ntk_t *p,word uTruth,Vec_Int_t *vSupp)

{
  uint i;
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = vSupp->nSize;
  i = (p->vObjType).nSize;
  uVar4 = i;
  if (i == (p->vObjType).nCap) {
    uVar5 = i * 2;
    if ((int)i < 0x10) {
      uVar5 = 0x10;
    }
    if ((int)i < (int)uVar5) {
      pcVar3 = (p->vObjType).pArray;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)malloc((ulong)uVar5);
      }
      else {
        pcVar3 = (char *)realloc(pcVar3,(ulong)uVar5);
        uVar4 = (p->vObjType).nSize;
      }
      (p->vObjType).pArray = pcVar3;
      (p->vObjType).nCap = uVar5;
    }
  }
  (p->vObjType).nSize = uVar4 + 1;
  (p->vObjType).pArray[(int)uVar4] = 'K';
  iVar1 = Acb_ObjIsBox(p,i);
  iVar1 = iVar1 + iVar2;
  iVar2 = p->nFaninMax;
  Vec_IntPush(&p->vObjFans,(p->vFanSto).nSize);
  Vec_IntPush(&p->vFanSto,0);
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  while (iVar1 != 0) {
    Vec_IntPush(&p->vFanSto,-1);
    iVar1 = iVar1 + -1;
  }
  iVar2 = Acb_ObjIsBox(p,i);
  if (iVar2 != 0) {
    __assert_fail("!Acb_ObjIsBox(p, iObj) || nFons > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0x1e7,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
  }
  if (0 < (p->vObjCopy).nSize) {
    Vec_IntPush(&p->vObjCopy,-1);
  }
  if (0 < (p->vObjFunc).nSize) {
    Vec_IntPush(&p->vObjFunc,-1);
  }
  if (0 < (p->vObjWeight).nSize) {
    Vec_IntPush(&p->vObjWeight,0);
  }
  uVar4 = (p->vObjTruth).nSize;
  if (0 < (int)uVar4) {
    if (uVar4 == (p->vObjTruth).nCap) {
      iVar2 = uVar4 * 2;
      if (uVar4 < 0x10) {
        iVar2 = 0x10;
      }
      Vec_WrdGrow(&p->vObjTruth,iVar2);
      uVar4 = (p->vObjTruth).nSize;
    }
    (p->vObjTruth).nSize = uVar4 + 1;
    (p->vObjTruth).pArray[(int)uVar4] = 0;
  }
  if (0 < (p->vObjName).nSize) {
    Vec_IntPush(&p->vObjName,0);
  }
  if (0 < (p->vObjRange).nSize) {
    Vec_IntPush(&p->vObjRange,0);
  }
  if (0 < (p->vObjTrav).nSize) {
    Vec_IntPush(&p->vObjTrav,0);
  }
  if (0 < (p->vObjAttr).nSize) {
    Vec_IntPush(&p->vObjAttr,0);
  }
  if (0 < (p->vLevelD).nSize) {
    Vec_IntPush(&p->vLevelD,0);
  }
  if (0 < (p->vLevelR).nSize) {
    Vec_IntPush(&p->vLevelR,0);
  }
  if (0 < (p->vPathD).nSize) {
    Vec_IntPush(&p->vPathD,0);
  }
  if (0 < (p->vPathR).nSize) {
    Vec_IntPush(&p->vPathR,0);
  }
  uVar4 = (p->vCounts).nSize;
  if (0 < (int)uVar4) {
    if (uVar4 == (p->vCounts).nCap) {
      iVar2 = uVar4 * 2;
      if (uVar4 < 0x10) {
        iVar2 = 0x10;
      }
      Vec_FltGrow(&p->vCounts,iVar2);
      uVar4 = (p->vCounts).nSize;
    }
    (p->vCounts).nSize = uVar4 + 1;
    (p->vCounts).pArray[(int)uVar4] = 0.0;
  }
  if (0 < (p->vFanouts).nSize) {
    Vec_WecPushLevel(&p->vFanouts);
  }
  if (0 < (p->vCnfs).nSize) {
    Vec_WecPushLevel(&p->vCnfs);
  }
  if (p->vQue != (Vec_Que_t *)0x0) {
    Vec_QueSetPriority(p->vQue,&(p->vCounts).pArray);
  }
  if ((int)i < 1) {
    pcVar3 = "i>0";
  }
  else {
    uVar4 = (p->vObjTruth).nSize;
    if (0 < (int)uVar4) {
      if (uVar4 <= i) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if ((p->vObjTruth).pArray[i] != 0) {
        __assert_fail("Acb_ObjTruth(p, i) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x11d,"void Acb_ObjSetTruth(Acb_Ntk_t *, int, word)");
      }
      Vec_WrdWriteEntry(&p->vObjTruth,i,uTruth);
      Acb_ObjAddFanins(p,i,vSupp);
      Acb_ObjAddFaninFanout(p,i);
      Acb_ObjComputeLevelD(p,i);
      return i;
    }
    pcVar3 = "Acb_NtkHasObjTruths(p)";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_NtkCreateNode( Acb_Ntk_t * p, word uTruth, Vec_Int_t * vSupp )
{
    int Pivot = Acb_ObjAlloc( p, ABC_OPER_LUT, Vec_IntSize(vSupp), 0 );
    Acb_ObjSetTruth( p, Pivot, uTruth );
    Acb_ObjAddFanins( p, Pivot, vSupp );
    Acb_ObjAddFaninFanout( p, Pivot );
    Acb_ObjComputeLevelD( p, Pivot );
    return Pivot;
}